

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

void ggml_visit_parents(ggml_cgraph *cgraph,ggml_tensor *node)

{
  ggml_tensor **ppgVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  undefined8 uVar5;
  char *pcVar6;
  long lVar7;
  
  uVar4 = 0;
  uVar3 = (ulong)(uint)cgraph->n_nodes;
  if (cgraph->n_nodes < 1) {
    uVar3 = uVar4;
  }
  do {
    if (uVar3 == uVar4) {
      uVar4 = 0;
      uVar3 = (ulong)(uint)cgraph->n_leafs;
      if (cgraph->n_leafs < 1) {
        uVar3 = uVar4;
      }
      do {
        if (uVar3 == uVar4) {
          if (node->src0 != (ggml_tensor *)0x0) {
            ggml_visit_parents(cgraph,node->src0);
          }
          if (node->src1 != (ggml_tensor *)0x0) {
            ggml_visit_parents(cgraph,node->src1);
          }
          for (lVar7 = 0xb; lVar7 != 0xf; lVar7 = lVar7 + 1) {
            if (*(ggml_tensor **)(node->ne + lVar7 * 2 + -2) != (ggml_tensor *)0x0) {
              ggml_visit_parents(cgraph,*(ggml_tensor **)(node->ne + lVar7 * 2 + -2));
            }
          }
          if ((node->op == GGML_OP_NONE) && (node->grad == (ggml_tensor *)0x0)) {
            iVar2 = cgraph->n_leafs;
            if ((long)iVar2 < 0x1000) {
              cgraph->leafs[iVar2] = node;
              cgraph->n_leafs = iVar2 + 1;
              return;
            }
            pcVar6 = "cgraph->n_leafs < GGML_MAX_NODES";
            uVar5 = 0x2333;
          }
          else {
            iVar2 = cgraph->n_nodes;
            lVar7 = (long)iVar2;
            if (lVar7 < 0x1000) {
              cgraph->nodes[lVar7] = node;
              cgraph->grads[lVar7] = node->grad;
              cgraph->n_nodes = iVar2 + 1;
              return;
            }
            pcVar6 = "cgraph->n_nodes < GGML_MAX_NODES";
            uVar5 = 0x2338;
          }
          fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",
                  uVar5,pcVar6);
          abort();
        }
        ppgVar1 = cgraph->leafs + uVar4;
        uVar4 = uVar4 + 1;
      } while (*ppgVar1 != node);
      return;
    }
    ppgVar1 = cgraph->nodes + uVar4;
    uVar4 = uVar4 + 1;
  } while (*ppgVar1 != node);
  return;
}

Assistant:

static void ggml_visit_parents(struct ggml_cgraph * cgraph, struct ggml_tensor * node) {
    if (node->grad == NULL) {
        // this usually happens when we generate intermediate nodes from constants in the backward pass
        // it can also happen during forward pass, if the user performs computations with constants
        if (node->op != GGML_OP_NONE) {
            //GGML_PRINT_DEBUG("%s: warning: node %p has no grad, but op %d\n", __func__, (void *) node, node->op);
        }
    }

    // check if already visited
    for (int i = 0; i < cgraph->n_nodes; i++) {
        if (cgraph->nodes[i] == node) {
            return;
        }
    }

    for (int i = 0; i < cgraph->n_leafs; i++) {
        if (cgraph->leafs[i] == node) {
            return;
        }
    }

    if (node->src0) {
        ggml_visit_parents(cgraph, node->src0);
    }

    if (node->src1) {
        ggml_visit_parents(cgraph, node->src1);
    }

    for (int i = 0; i < GGML_MAX_OPT; ++i) {
        if (node->opt[i]) {
            ggml_visit_parents(cgraph, node->opt[i]);
        }
    }

    if (node->op == GGML_OP_NONE && node->grad == NULL) {
        // reached a leaf node, not part of the gradient graph (e.g. a constant)
        GGML_ASSERT(cgraph->n_leafs < GGML_MAX_NODES);

        cgraph->leafs[cgraph->n_leafs] = node;
        cgraph->n_leafs++;
    } else {
        GGML_ASSERT(cgraph->n_nodes < GGML_MAX_NODES);

        cgraph->nodes[cgraph->n_nodes] = node;
        cgraph->grads[cgraph->n_nodes] = node->grad;
        cgraph->n_nodes++;
    }
}